

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

Vec_Ptr_t * Bac_PtrTransformTest(Vec_Ptr_t *vDes)

{
  int iVar1;
  Abc_Frame_t *pAVar2;
  Mio_Library_t *pLib_00;
  Vec_Ptr_t *vGatesNames_00;
  char *pcVar3;
  Vec_Ptr_t *pVVar4;
  int local_3c;
  int i;
  Vec_Ptr_t *vNew;
  Vec_Ptr_t *vNtk;
  Vec_Ptr_t *vGatesNames;
  Mio_Library_t *pLib;
  Vec_Ptr_t *vDes_local;
  
  Bac_PtrDumpBlif("test1.blif",vDes);
  pAVar2 = Abc_FrameGetGlobalFrame();
  if (pAVar2 == (Abc_Frame_t *)0x0) {
    printf("ABC framework is not started.\n");
    vDes_local = (Vec_Ptr_t *)0x0;
  }
  else {
    pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
    if (pLib_00 == (Mio_Library_t *)0x0) {
      printf("Standard cell library is not entered.\n");
      vDes_local = (Vec_Ptr_t *)0x0;
    }
    else {
      vGatesNames_00 = Bac_ManCollectGateNamesByTruth(pLib_00);
      iVar1 = Vec_PtrSize(vDes);
      vDes_local = Vec_PtrAllocExact(iVar1);
      pcVar3 = (char *)Vec_PtrEntry(vDes,0);
      pcVar3 = Abc_UtilStrsav(pcVar3);
      Vec_PtrPush(vDes_local,pcVar3);
      for (local_3c = 1; iVar1 = Vec_PtrSize(vDes), local_3c < iVar1; local_3c = local_3c + 1) {
        pVVar4 = (Vec_Ptr_t *)Vec_PtrEntry(vDes,local_3c);
        pVVar4 = Bac_PtrTransformNtk(pVVar4,vGatesNames_00);
        Vec_PtrPush(vDes_local,pVVar4);
      }
      Bac_PtrDumpBlif("test2.blif",vDes_local);
      Vec_PtrFree(vGatesNames_00);
    }
  }
  return vDes_local;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformTest( Vec_Ptr_t * vDes )
{
    Mio_Library_t * pLib;
    Vec_Ptr_t * vGatesNames;
    Vec_Ptr_t * vNtk, * vNew; int i;
    // dump BLIF before transformation
    Bac_PtrDumpBlif( "test1.blif", vDes );
    if ( Abc_FrameGetGlobalFrame() == NULL )
    {
        printf( "ABC framework is not started.\n" );
        return NULL;
    }
    pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pLib == NULL )
    {
        printf( "Standard cell library is not entered.\n" );
        return NULL;
    }
    vGatesNames = Bac_ManCollectGateNamesByTruth( pLib );
    // transform
    vNew = Vec_PtrAllocExact( Vec_PtrSize(vDes) );
    Vec_PtrPush( vNew, Abc_UtilStrsav((char *)Vec_PtrEntry(vDes, 0)) );
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vDes, vNtk, i, 1 )
        Vec_PtrPush( vNew, Bac_PtrTransformNtk(vNtk, vGatesNames) );
    // dump BLIF after transformation
    Bac_PtrDumpBlif( "test2.blif", vNew );
    Vec_PtrFree( vGatesNames );
    return vNew;
}